

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fuseahuref(ASMState *as,IRRef ref,RegSet allow)

{
  IRIns *ir;
  byte bVar1;
  Reg RVar2;
  long lVar3;
  IRIns *pIVar4;
  
  pIVar4 = as->ir;
  bVar1 = *(byte *)((long)pIVar4 + (ulong)ref * 8 + 6);
  if ((char)bVar1 < '\0') {
    ir = pIVar4 + ref;
    switch((ir->field_1).o) {
    case '8':
      if (as->fuseref < ref) {
        asm_fusearef(as,ir,allow);
        return;
      }
      break;
    case '9':
      if (as->fuseref < ref) {
        bVar1 = *(byte *)((long)pIVar4 + (ulong)(ir->field_0).op1 * 8 + 6);
        if ((char)bVar1 < '\0') {
          RVar2 = ra_allocref(as,(uint)(ir->field_0).op1,allow);
          bVar1 = (byte)RVar2;
          pIVar4 = as->ir;
        }
        as->weakset = as->weakset & (-2 << (bVar1 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar1 & 0x1f));
        (as->mrm).base = bVar1;
        (as->mrm).ofs = (uint)*(ushort *)((long)pIVar4 + (ulong)(ir->field_0).op2 * 8 + 2) * 0x18;
        goto LAB_0013f48b;
      }
      break;
    case '=':
      if ((-1 < (long)(short)(ir->field_0).op1) &&
         (lVar3 = *(long *)((long)pIVar4[(long)(short)(ir->field_0).op1 + 1] + 0x28 +
                           (ulong)*(byte *)((long)&(ir->field_0).op2 + 1) * 8) - (long)as->J,
         (lVar3 + 0x7ffff368U | lVar3 + 0x7ffff36cU) >> 0x20 == 0)) {
        (as->mrm).ofs = (int)lVar3 + -0xc98;
        goto LAB_0013f4a4;
      }
      break;
    case '?':
      (as->mrm).ofs = -0xe98;
LAB_0013f4a4:
      (as->mrm).base = '\x0e';
      (as->mrm).idx = 0x80;
      return;
    }
    RVar2 = ra_allocref(as,ref,allow);
    bVar1 = (byte)RVar2;
  }
  as->weakset = as->weakset & (-2 << (bVar1 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar1 & 0x1f));
  (as->mrm).base = bVar1;
  (as->mrm).ofs = 0;
LAB_0013f48b:
  (as->mrm).idx = 0x80;
  return;
}

Assistant:

static void asm_fuseahuref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  if (ra_noreg(ir->r)) {
    switch ((IROp)ir->o) {
    case IR_AREF:
      if (mayfuse(as, ref)) {
	asm_fusearef(as, ir, allow);
	return;
      }
      break;
    case IR_HREFK:
      if (mayfuse(as, ref)) {
	as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
	as->mrm.ofs = (int32_t)(IR(ir->op2)->op2 * sizeof(Node));
	as->mrm.idx = RID_NONE;
	return;
      }
      break;
    case IR_UREFC:
      if (irref_isk(ir->op1)) {
	GCfunc *fn = ir_kfunc(IR(ir->op1));
	GCupval *uv = &gcref(fn->l.uvptr[(ir->op2 >> 8)])->uv;
#if LJ_GC64
	int64_t ofs = dispofs(as, &uv->tv);
	if (checki32(ofs) && checki32(ofs+4)) {
	  as->mrm.ofs = (int32_t)ofs;
	  as->mrm.base = RID_DISPATCH;
	  as->mrm.idx = RID_NONE;
	  return;
	}
#else
	as->mrm.ofs = ptr2addr(&uv->tv);
	as->mrm.base = as->mrm.idx = RID_NONE;
	return;
#endif
      }
      break;
    case IR_TMPREF:
#if LJ_GC64
      as->mrm.ofs = (int32_t)dispofs(as, &J2G(as->J)->tmptv);
      as->mrm.base = RID_DISPATCH;
      as->mrm.idx = RID_NONE;
#else
      as->mrm.ofs = igcptr(&J2G(as->J)->tmptv);
      as->mrm.base = as->mrm.idx = RID_NONE;
#endif
      return;
    default:
      break;
    }
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ref, allow);
  as->mrm.ofs = 0;
  as->mrm.idx = RID_NONE;
}